

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O1

StrScanFmt
strscan_hex(uint8_t *p,TValue *o,StrScanFmt fmt,uint32_t opt,int32_t ex2,int32_t neg,uint32_t dig)

{
  int32_t ex2_00;
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t uVar6;
  int iVar7;
  
  if (dig == 0) {
    uVar3 = 0;
  }
  else {
    uVar6 = 0x10;
    if (dig < 0x10) {
      uVar6 = dig;
    }
    uVar3 = 0;
    do {
      bVar1 = *p;
      if (bVar1 == 0x2e) {
        bVar1 = p[1];
        p = p + 1;
      }
      uVar2 = bVar1 + 9;
      if (bVar1 < 0x3a) {
        uVar2 = (uint)bVar1;
      }
      uVar3 = (ulong)(uVar2 & 0xf) | uVar3 << 4;
      p = p + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  if (0x10 < dig) {
    iVar7 = dig - 0x10;
    do {
      bVar1 = *p;
      if (bVar1 == 0x2e) {
        bVar1 = p[1];
        p = p + 1;
      }
      uVar3 = uVar3 | bVar1 != 0x30;
      p = p + 1;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    ex2 = ex2 + dig * 4 + -0x40;
  }
  if (fmt - STRSCAN_I64 < 2) {
    if (dig < 0x11) {
      uVar5 = -uVar3;
      if (neg == 0) {
        uVar5 = uVar3;
      }
      o->u64 = uVar5;
      return fmt;
    }
  }
  else {
    uVar2 = (uint)uVar3;
    if (fmt != STRSCAN_U32) {
      if (fmt != STRSCAN_INT) {
LAB_00128389:
        uVar5 = (ulong)(uVar2 & 3) | uVar3 >> 2;
        ex2_00 = ex2 + 2;
        if (uVar3 >> 0x3e == 0) {
          uVar5 = uVar3;
          ex2_00 = ex2;
        }
        strscan_double(uVar5,o,ex2_00,neg);
        return fmt;
      }
      if ((((opt & 2) == 0) && (uVar3 < (neg | 0x80000000))) && ((neg == 0 || (uVar3 != 0)))) {
        uVar4 = -uVar2;
        if (neg == 0) {
          uVar4 = uVar2;
        }
        (o->field_4).i = uVar4;
        return STRSCAN_INT;
      }
      fmt = STRSCAN_NUM;
      if ((opt & 0x10) == 0) goto LAB_00128389;
    }
    if (dig < 9) {
      uVar4 = -uVar2;
      if (neg == 0) {
        uVar4 = uVar2;
      }
      (o->field_4).i = uVar4;
      return STRSCAN_U32;
    }
  }
  return STRSCAN_ERROR;
}

Assistant:

static StrScanFmt strscan_hex(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, uint32_t opt,
			      int32_t ex2, int32_t neg, uint32_t dig)
{
  uint64_t x = 0;
  uint32_t i;

  /* Scan hex digits. */
  for (i = dig > 16 ? 16 : dig ; i; i--, p++) {
    uint32_t d = (*p != '.' ? *p : *++p); if (d > '9') d += 9;
    x = (x << 4) + (d & 15);
  }

  /* Summarize rounding-effect of excess digits. */
  for (i = 16; i < dig; i++, p++)
    x |= ((*p != '.' ? *p : *++p) != '0'), ex2 += 4;

  /* Format-specific handling. */
  switch (fmt) {
  case STRSCAN_INT:
    if (!(opt & STRSCAN_OPT_TONUM) && x < 0x80000000u+neg &&
	!(x == 0 && neg)) {
      o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
      return STRSCAN_INT;  /* Fast path for 32 bit integers. */
    }
    if (!(opt & STRSCAN_OPT_C)) { fmt = STRSCAN_NUM; break; }
    /* fallthrough */
  case STRSCAN_U32:
    if (dig > 8) return STRSCAN_ERROR;
    o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
    return STRSCAN_U32;
  case STRSCAN_I64:
  case STRSCAN_U64:
    if (dig > 16) return STRSCAN_ERROR;
    o->u64 = neg ? ~x+1u : x;
    return fmt;
  default:
    break;
  }

  /* Reduce range, then convert to double. */
  if ((x & U64x(c0000000,0000000))) { x = (x >> 2) | (x & 3); ex2 += 2; }
  strscan_double(x, o, ex2, neg);
  return fmt;
}